

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O0

deUint32 tcu::colorDistSquared(deUint32 pa,deUint32 pb)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int a;
  int b;
  int g;
  int r;
  deUint32 pb_local;
  deUint32 pa_local;
  
  bVar1 = getChannel<0>(pa);
  bVar2 = getChannel<0>(pb);
  iVar3 = de::abs<int>((uint)bVar1 - (uint)bVar2);
  iVar3 = de::max<int>(iVar3 + -4,0);
  bVar1 = getChannel<1>(pa);
  bVar2 = getChannel<1>(pb);
  iVar4 = de::abs<int>((uint)bVar1 - (uint)bVar2);
  iVar4 = de::max<int>(iVar4 + -4,0);
  bVar1 = getChannel<2>(pa);
  bVar2 = getChannel<2>(pb);
  iVar5 = de::abs<int>((uint)bVar1 - (uint)bVar2);
  iVar5 = de::max<int>(iVar5 + -4,0);
  bVar1 = getChannel<3>(pa);
  bVar2 = getChannel<3>(pb);
  iVar6 = de::abs<int>((uint)bVar1 - (uint)bVar2);
  iVar6 = de::max<int>(iVar6 + -4,0);
  return iVar3 * iVar3 + iVar4 * iVar4 + iVar5 * iVar5 + iVar6 * iVar6;
}

Assistant:

static inline deUint32 colorDistSquared (deUint32 pa, deUint32 pb)
{
	const int	r	= de::max<int>(de::abs((int)getChannel<0>(pa) - (int)getChannel<0>(pb)) - MIN_ERR_THRESHOLD, 0);
	const int	g	= de::max<int>(de::abs((int)getChannel<1>(pa) - (int)getChannel<1>(pb)) - MIN_ERR_THRESHOLD, 0);
	const int	b	= de::max<int>(de::abs((int)getChannel<2>(pa) - (int)getChannel<2>(pb)) - MIN_ERR_THRESHOLD, 0);
	const int	a	= de::max<int>(de::abs((int)getChannel<3>(pa) - (int)getChannel<3>(pb)) - MIN_ERR_THRESHOLD, 0);

	return deUint32(r*r + g*g + b*b + a*a);
}